

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  uint uVar1;
  U32 UVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar7 = (ms->cParams).chainLog;
  if (iend < ip + 8) {
    __assert_fail("ip + 8 <= iend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3efe,
                  "void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)");
  }
  uVar1 = ms->nextToUpdate;
  uVar8 = (ulong)uVar1;
  if (uVar1 < (ms->window).dictLimit) {
    __assert_fail("idx >= ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3f01,
                  "void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)");
  }
  pBVar3 = (ms->window).base;
  uVar9 = (uint)((long)ip - (long)pBVar3);
  if (uVar1 < uVar9) {
    pUVar4 = ms->hashTable;
    pUVar5 = ms->chainTable;
    cVar6 = (char)(ms->cParams).hashLog;
    do {
      switch(mls) {
      case 5:
        uVar11 = *(long *)(pBVar3 + uVar8) * -0x30e4432345000000;
        break;
      case 6:
        uVar11 = *(long *)(pBVar3 + uVar8) * -0x30e4432340650000;
        break;
      case 7:
        uVar11 = *(long *)(pBVar3 + uVar8) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar11 = *(long *)(pBVar3 + uVar8) * -0x30e44323485a9b9d;
        break;
      default:
        uVar11 = (ulong)((uint)(*(int *)(pBVar3 + uVar8) * -0x61c8864f) >> (0x20U - cVar6 & 0x1f));
        goto LAB_0017458f;
      }
      uVar11 = uVar11 >> (0x40U - cVar6 & 0x3f);
LAB_0017458f:
      UVar2 = pUVar4[uVar11];
      uVar10 = (ulong)(((uint)uVar8 & ~(-1 << ((char)uVar7 - 1U & 0x1f))) * 2);
      pUVar4[uVar11] = (uint)uVar8;
      pUVar5[uVar10] = UVar2;
      pUVar5[uVar10 + 1] = 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < ((long)ip - (long)pBVar3 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar9;
  return;
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}